

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label,ImGuiWindow *docked_window)

{
  ImU32 id;
  ImGuiID IVar1;
  
  if (docked_window == (ImGuiWindow *)0x0) {
    IVar1 = ImGuiWindow::GetID(GImGui->CurrentWindow,label,(char *)0x0);
    return IVar1;
  }
  if ((tab_bar->Flags & 0x100000) != 0) {
    id = ImHashStr(label,0,0);
    KeepAliveID(id);
    return id;
  }
  __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x1c5e,"ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *, const char *, ImGuiWindow *)");
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label, ImGuiWindow* docked_window)
{
    if (docked_window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}